

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O3

int print_hex(BIO *bp,uint8_t *data,size_t len,int off)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if (len == uVar3) {
      iVar1 = BIO_write((BIO *)bp,"\n",1);
      return (uint)(0 < iVar1);
    }
    if ((uVar3 / 0xf) * 0xf == uVar3) {
      iVar1 = BIO_puts((BIO *)bp,"\n");
      if (iVar1 < 1) {
        return 0;
      }
      iVar1 = BIO_indent((BIO *)bp,off + 4,0x80);
      if (iVar1 == 0) {
        return 0;
      }
    }
    pcVar2 = ":";
    if (len - 1 == uVar3) {
      pcVar2 = "";
    }
    iVar1 = BIO_printf((BIO *)bp,"%02x%s",(ulong)data[uVar3],pcVar2);
    uVar3 = uVar3 + 1;
    if (iVar1 < 1) {
      return 0;
    }
  } while( true );
}

Assistant:

static int print_hex(BIO *bp, const uint8_t *data, size_t len, int off) {
  for (size_t i = 0; i < len; i++) {
    if ((i % 15) == 0) {
      if (BIO_puts(bp, "\n") <= 0 ||  //
          !BIO_indent(bp, off + 4, 128)) {
        return 0;
      }
    }
    if (BIO_printf(bp, "%02x%s", data[i], (i + 1 == len) ? "" : ":") <= 0) {
      return 0;
    }
  }
  if (BIO_write(bp, "\n", 1) <= 0) {
    return 0;
  }
  return 1;
}